

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgio.c
# Opt level: O2

int fd_send(int sock,int *fds,size_t nfds)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  cmsghdr *__cmsg;
  ssize_t sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 local_91;
  ulong local_90;
  int *local_88;
  ulong local_80;
  iovec iov;
  msghdr msg;
  
  if (fds == (int *)0x0 || nfds == 0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
LAB_0010689a:
    iVar2 = -1;
  }
  else {
    uVar5 = 0;
    local_88 = fds;
    local_80 = nfds;
    while( true ) {
      piVar3 = local_88;
      local_90 = (ulong)uVar5;
      uVar7 = local_80 - local_90;
      if (local_80 < local_90 || uVar7 == 0) break;
      if (0x5e7 < uVar7) {
        uVar7 = 0x5e8;
      }
      if (sock < 0) {
        __assert_fail("sock >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                      ,0xec,"int fd_package_send(int, const int *, size_t)");
      }
      bzero((msghdr *)&msg,0x38);
      local_91 = 0;
      iov.iov_len = 1;
      msg.msg_iov = &iov;
      msg.msg_iovlen = 1;
      msg.msg_controllen = uVar7 * 0x18;
      iov.iov_base = &local_91;
      __cmsg = (cmsghdr *)calloc(1,msg.msg_controllen);
      uVar1 = local_90;
      if (__cmsg == (cmsghdr *)0x0) goto LAB_0010689a;
      uVar6 = 0;
      msg.msg_control = __cmsg;
      while ((uVar6 < uVar7 && (__cmsg != (cmsghdr *)0x0))) {
        iVar2 = piVar3[uVar1 + uVar6];
        if (iVar2 < 0) {
          __assert_fail("fd >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                        ,0x50,"int msghdr_add_fd(struct cmsghdr *, int)");
        }
        __cmsg->cmsg_level = 1;
        __cmsg->cmsg_type = 1;
        __cmsg->cmsg_len = 0x14;
        *(int *)&__cmsg[1].cmsg_len = iVar2;
        __cmsg = __cmsg_nxthdr((msghdr *)&msg,__cmsg);
        uVar6 = uVar6 + 1;
      }
      while( true ) {
        fd_wait(sock,false);
        sVar4 = sendmsg(sock,(msghdr *)&msg,0);
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        if (sVar4 != -1) break;
        if (iVar2 != 4) {
          free(msg.msg_control);
          *piVar3 = iVar2;
          goto LAB_0010689a;
        }
      }
      free(msg.msg_control);
      *piVar3 = iVar2;
      uVar5 = (int)local_90 + (int)uVar7;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
fd_send(int sock, const int *fds, size_t nfds)
{
	unsigned int i, step;
	int ret;

	if (nfds == 0 || fds == NULL) {
		errno = EINVAL;
		return (-1);
	}

	ret = i = step = 0;
	while (i < nfds) {
		if (PKG_MAX_SIZE < nfds - i)
			step = PKG_MAX_SIZE;
		else
			step = nfds - i;
		ret = fd_package_send(sock, fds + i, step);
		if (ret != 0)
			break;
		i += step;
	}

	return (ret);
}